

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

reference<mpt::layout> * __thiscall
mpt::unique_array<mpt::reference<mpt::layout>_>::insert
          (unique_array<mpt::reference<mpt::layout>_> *this,long pos)

{
  bool bVar1;
  int iVar2;
  buffer *this_00;
  type_traits *ptVar3;
  type_traits *traits;
  void *ptr;
  content<mpt::reference<mpt::layout>_> *d;
  long len;
  long pos_local;
  unique_array<mpt::reference<mpt::layout>_> *this_local;
  
  d = (content<mpt::reference<mpt::layout>_> *)length(this);
  if (pos < 0) {
    len = (long)&(d->super_buffer)._vptr_buffer + pos;
    if (len < 0) {
      return (reference<mpt::layout> *)0x0;
    }
  }
  else {
    len = pos;
    if ((long)d < pos) {
      d = (content<mpt::reference<mpt::layout>_> *)pos;
    }
  }
  bVar1 = reserve(this,(long)((long)&(d->super_buffer)._vptr_buffer + 1));
  if (bVar1) {
    this_00 = &reference<mpt::content<mpt::reference<mpt::layout>_>_>::instance(&this->_ref)->
               super_buffer;
    this_local = (unique_array<mpt::reference<mpt::layout>_> *)
                 content<mpt::reference<mpt::layout>_>::insert
                           ((content<mpt::reference<mpt::layout>_> *)this_00,len);
    if (this_local == (unique_array<mpt::reference<mpt::layout>_> *)0x0) {
      this_local = (unique_array<mpt::reference<mpt::layout>_> *)0x0;
    }
    else {
      ptVar3 = buffer::content_traits(this_00);
      if (((ptVar3 == (type_traits *)0x0) || (ptVar3->init == (_func_int_void_ptr_void_ptr *)0x0))
         || (iVar2 = (*ptVar3->init)(this_local,(void *)0x0), iVar2 < 0)) {
        reference<mpt::layout>::reference((reference<mpt::layout> *)this_local,(layout *)0x0);
      }
    }
  }
  else {
    this_local = (unique_array<mpt::reference<mpt::layout>_> *)0x0;
  }
  return (reference<mpt::layout> *)this_local;
}

Assistant:

T *insert(long pos)
	{
		long len = length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!reserve(len + 1)) {
			return 0;
		}
		content<T> *d = _ref.instance();
		/* inserted raw data is NOT initialized */
		void *ptr = d->insert(pos);
		if (!ptr) {
			return 0;
		}
		const struct type_traits *traits = d->content_traits();
		if (traits && traits->init && traits->init(ptr, 0) >= 0) {
			return static_cast<T *>(ptr);
		}
		return new (ptr) T;
	}